

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCRgba.cpp
# Opt level: O3

void anon_unknown.dwarf_2d9809::convertImfRgbaToRgbaPixels
               (Array2D<ImfRgba> *ImfRgbaPixels,Array2D<Imf_3_4::Rgba> *RgbaPixels,int w,int h)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  if (0 < h) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (0 < w) {
        lVar4 = 0;
        do {
          uVar7 = ImfHalfToFloat(*(undefined2 *)
                                  ((long)&ImfRgbaPixels->_data->r +
                                  lVar4 + ImfRgbaPixels->_sizeY * lVar5));
          uVar3 = uVar7 & 0x7fffffff;
          uVar2 = (ushort)(uVar7 >> 0x10) & 0x8000;
          if (uVar3 < 0x38800000) {
            if ((0x33000000 < uVar3) &&
               (cVar1 = (char)(uVar3 >> 0x17), uVar3 = uVar7 & 0x7fffff | 0x800000,
               uVar2 = uVar2 | (ushort)(uVar3 >> (0x7eU - cVar1 & 0x1f)),
               0x80000000 < uVar3 << (cVar1 + 0xa2U & 0x1f))) {
              uVar2 = uVar2 + 1;
            }
          }
          else if (uVar3 < 0x7f800000) {
            if (uVar3 < 0x477ff000) {
              uVar2 = (ushort)(uVar3 + 0x8000fff + (uint)((uVar3 >> 0xd & 1) != 0) >> 0xd) | uVar2;
            }
            else {
              uVar2 = uVar2 | 0x7c00;
            }
          }
          else {
            uVar2 = uVar2 | 0x7c00;
            if (uVar3 != 0x7f800000) {
              uVar3 = uVar3 >> 0xd & 0x3ff;
              uVar2 = uVar2 | (ushort)uVar3 | (ushort)(uVar3 == 0);
            }
          }
          *(ushort *)((long)&(RgbaPixels->_data->r)._h + lVar4 + RgbaPixels->_sizeY * lVar5) = uVar2
          ;
          uVar7 = ImfHalfToFloat(*(undefined2 *)
                                  ((long)&ImfRgbaPixels->_data->g +
                                  lVar4 + ImfRgbaPixels->_sizeY * lVar5));
          uVar3 = uVar7 & 0x7fffffff;
          uVar2 = (ushort)(uVar7 >> 0x10) & 0x8000;
          if (uVar3 < 0x38800000) {
            if ((0x33000000 < uVar3) &&
               (uVar7 = uVar7 & 0x7fffff | 0x800000, cVar1 = (char)(uVar3 >> 0x17),
               uVar2 = uVar2 | (ushort)(uVar7 >> (0x7eU - cVar1 & 0x1f)),
               0x80000000 < uVar7 << (cVar1 + 0xa2U & 0x1f))) {
              uVar2 = uVar2 + 1;
            }
          }
          else if (uVar3 < 0x7f800000) {
            if (uVar3 < 0x477ff000) {
              uVar2 = (ushort)(uVar3 + 0x8000fff + (uint)((uVar3 >> 0xd & 1) != 0) >> 0xd) | uVar2;
            }
            else {
              uVar2 = uVar2 | 0x7c00;
            }
          }
          else {
            uVar2 = uVar2 | 0x7c00;
            if (uVar3 != 0x7f800000) {
              uVar3 = uVar3 >> 0xd & 0x3ff;
              uVar2 = uVar2 | (ushort)uVar3 | (ushort)(uVar3 == 0);
            }
          }
          *(ushort *)((long)&(RgbaPixels->_data->g)._h + lVar4 + RgbaPixels->_sizeY * lVar5) = uVar2
          ;
          uVar7 = ImfHalfToFloat(*(undefined2 *)
                                  ((long)&ImfRgbaPixels->_data->b +
                                  lVar4 + ImfRgbaPixels->_sizeY * lVar5));
          uVar3 = uVar7 & 0x7fffffff;
          uVar2 = (ushort)(uVar7 >> 0x10) & 0x8000;
          if (uVar3 < 0x38800000) {
            if ((0x33000000 < uVar3) &&
               (uVar7 = uVar7 & 0x7fffff | 0x800000, cVar1 = (char)(uVar3 >> 0x17),
               uVar2 = uVar2 | (ushort)(uVar7 >> (0x7eU - cVar1 & 0x1f)),
               0x80000000 < uVar7 << (cVar1 + 0xa2U & 0x1f))) {
              uVar2 = uVar2 + 1;
            }
          }
          else if (uVar3 < 0x7f800000) {
            if (uVar3 < 0x477ff000) {
              uVar2 = (ushort)(uVar3 + 0x8000fff + (uint)((uVar3 >> 0xd & 1) != 0) >> 0xd) | uVar2;
            }
            else {
              uVar2 = uVar2 | 0x7c00;
            }
          }
          else {
            uVar2 = uVar2 | 0x7c00;
            if (uVar3 != 0x7f800000) {
              uVar3 = uVar3 >> 0xd & 0x3ff;
              uVar2 = uVar2 | (ushort)uVar3 | (ushort)(uVar3 == 0);
            }
          }
          *(ushort *)((long)&(RgbaPixels->_data->b)._h + lVar4 + RgbaPixels->_sizeY * lVar5) = uVar2
          ;
          uVar7 = ImfHalfToFloat(*(undefined2 *)
                                  ((long)&ImfRgbaPixels->_data->a +
                                  lVar4 + ImfRgbaPixels->_sizeY * lVar5));
          uVar3 = uVar7 & 0x7fffffff;
          uVar2 = (ushort)(uVar7 >> 0x10) & 0x8000;
          if (uVar3 < 0x38800000) {
            if ((0x33000000 < uVar3) &&
               (uVar7 = uVar7 & 0x7fffff | 0x800000, cVar1 = (char)(uVar3 >> 0x17),
               uVar2 = uVar2 | (ushort)(uVar7 >> (0x7eU - cVar1 & 0x1f)),
               0x80000000 < uVar7 << (cVar1 + 0xa2U & 0x1f))) {
              uVar2 = uVar2 + 1;
            }
          }
          else if (uVar3 < 0x7f800000) {
            if (uVar3 < 0x477ff000) {
              uVar2 = (ushort)(uVar3 + 0x8000fff + (uint)((uVar3 >> 0xd & 1) != 0) >> 0xd) | uVar2;
            }
            else {
              uVar2 = uVar2 | 0x7c00;
            }
          }
          else {
            uVar2 = uVar2 | 0x7c00;
            if (uVar3 != 0x7f800000) {
              uVar3 = uVar3 >> 0xd & 0x3ff;
              uVar2 = uVar2 | (ushort)uVar3 | (ushort)(uVar3 == 0);
            }
          }
          *(ushort *)((long)&(RgbaPixels->_data->a)._h + lVar4 + RgbaPixels->_sizeY * lVar5) = uVar2
          ;
          lVar4 = lVar4 + 8;
        } while ((ulong)(uint)w << 3 != lVar4);
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar6 != (uint)h);
  }
  return;
}

Assistant:

void 
convertImfRgbaToRgbaPixels (const Array2D<ImfRgba>& ImfRgbaPixels,
                            Array2D<Rgba>& RgbaPixels, 
                            int w, 
                            int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            RgbaPixels[y][x].r = ImfHalfToFloat (ImfRgbaPixels[y][x].r);
            RgbaPixels[y][x].g = ImfHalfToFloat (ImfRgbaPixels[y][x].g);
            RgbaPixels[y][x].b = ImfHalfToFloat (ImfRgbaPixels[y][x].b);
            RgbaPixels[y][x].a = ImfHalfToFloat (ImfRgbaPixels[y][x].a);
        }
    }
}